

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::FillDynamicLayerParams::SerializeWithCachedSizes
          (FillDynamicLayerParams *this,CodedOutputStream *output)

{
  float fVar1;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  FillDynamicLayerParams *this_local;
  
  fVar1 = value(this);
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    fVar1 = value(this);
    google::protobuf::internal::WireFormatLite::WriteFloat(1,fVar1,output);
  }
  return;
}

Assistant:

void FillDynamicLayerParams::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.FillDynamicLayerParams)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // float value = 1;
  if (this->value() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteFloat(1, this->value(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.FillDynamicLayerParams)
}